

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim)

{
  SQUnsignedInteger SVar1;
  uint uVar2;
  ulong uVar3;
  SQInteger SVar4;
  ulong uVar5;
  char *pcVar6;
  LexChar LVar7;
  SQInteger t;
  SQUnsignedInteger SVar8;
  SQChar temp [9];
  SQChar *stemp;
  char *local_50 [2];
  sqvector<char> *local_40;
  char *local_38;
  
  local_50[0]._0_1_ = '\0';
  sqvector<char>::resize(&this->_longstr,0,(char *)local_50);
  uVar3 = (*this->_readf)(this->_up);
  if ((long)uVar3 < 0x100) {
    if (uVar3 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
      this->_currentcolumn = this->_currentcolumn + 1;
      return -1;
    }
  }
  else {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  this->_currdata = (LexChar)uVar3;
  this->_currentcolumn = this->_currentcolumn + 1;
  local_40 = &this->_longstr;
  if ((LexChar)uVar3 == '\0') {
    return -1;
  }
LAB_00120b29:
  uVar5 = uVar3 & 0xff;
  while (uVar5 != ndelim) {
    if ((char)uVar3 == '\n') {
      LVar7 = '\n';
      if (!verbatim) {
        (*this->_errfunc)(this->_errtarget,"newline in a constant");
        LVar7 = this->_currdata;
      }
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = LVar7;
      SVar4 = (*this->_readf)(this->_up);
      if (SVar4 < 0x100) {
        if (SVar4 != 0) goto LAB_00120d01;
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00120d01:
        this->_currdata = (LexChar)SVar4;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_currentline = this->_currentline + 1;
      goto LAB_00120d0d;
    }
    if (((uint)uVar3 & 0xff) != 0x5c) {
      if ((uVar3 & 0xff) == 0) {
        (*this->_errfunc)(this->_errtarget,"unfinished string");
        return -1;
      }
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar5 = (this->_longstr)._size;
      if (SVar1 <= uVar5) {
        SVar8 = uVar5 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar5 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar5 + 1;
      pcVar6[uVar5] = (char)uVar3;
      goto LAB_00120c10;
    }
    if (verbatim) {
LAB_00120bc9:
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = '\\';
      goto LAB_00120c10;
    }
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_00120d37;
      this->_currdata = '\0';
      this->_reached_eof = 1;
      this->_currentcolumn = this->_currentcolumn + 1;
switchD_00120dd2_caseD_6f:
      (*this->_errfunc)(this->_errtarget,"unrecognised escaper char");
      goto LAB_00120d0d;
    }
    (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00120d37:
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar2 = (uint)SVar4 & 0xff;
    if (uVar2 < 0x62) {
      if (uVar2 < 0x55) {
        if (uVar2 == 0x22) {
          SVar1 = (this->_longstr)._allocated;
          pcVar6 = (this->_longstr)._vals;
          uVar3 = (this->_longstr)._size;
          if (SVar1 <= uVar3) {
            SVar8 = uVar3 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = SVar8;
            uVar3 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar3 + 1;
          pcVar6[uVar3] = '\"';
        }
        else if (uVar2 == 0x27) {
          SVar1 = (this->_longstr)._allocated;
          pcVar6 = (this->_longstr)._vals;
          uVar3 = (this->_longstr)._size;
          if (SVar1 <= uVar3) {
            SVar8 = uVar3 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = SVar8;
            uVar3 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar3 + 1;
          pcVar6[uVar3] = '\'';
        }
        else {
          if (uVar2 != 0x30) goto switchD_00120dd2_caseD_6f;
          SVar1 = (this->_longstr)._allocated;
          pcVar6 = (this->_longstr)._vals;
          uVar3 = (this->_longstr)._size;
          if (SVar1 <= uVar3) {
            SVar8 = uVar3 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = SVar8;
            uVar3 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar3 + 1;
          pcVar6[uVar3] = '\0';
        }
      }
      else {
        if (uVar2 == 0x55) goto switchD_00120dd2_caseD_75;
        if (uVar2 == 0x5c) goto LAB_00120bc9;
        if (uVar2 != 0x61) goto switchD_00120dd2_caseD_6f;
        SVar1 = (this->_longstr)._allocated;
        pcVar6 = (this->_longstr)._vals;
        uVar3 = (this->_longstr)._size;
        if (SVar1 <= uVar3) {
          SVar8 = uVar3 * 2;
          if (SVar8 == 0) {
            SVar8 = 4;
          }
          pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
          (this->_longstr)._vals = pcVar6;
          (this->_longstr)._allocated = SVar8;
          uVar3 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar3 + 1;
        pcVar6[uVar3] = '\a';
      }
      goto LAB_00120c10;
    }
    switch(uVar2) {
    case 0x6e:
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = '\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
      goto switchD_00120dd2_caseD_6f;
    case 0x72:
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = '\r';
      break;
    case 0x74:
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = '\t';
      break;
    case 0x75:
switchD_00120dd2_caseD_75:
      ProcessStringHexEscape(this,(SQChar *)local_50,8);
      uVar3 = strtoul((char *)local_50,&local_38,0x10);
      AddUTF8(this,uVar3);
      goto LAB_00120d0d;
    case 0x76:
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = '\v';
      break;
    case 0x78:
      ProcessStringHexEscape(this,(SQChar *)&local_38,2);
      uVar5 = strtoul((char *)&local_38,local_50,0x10);
      SVar1 = (this->_longstr)._allocated;
      pcVar6 = (this->_longstr)._vals;
      uVar3 = (this->_longstr)._size;
      if (SVar1 <= uVar3) {
        SVar8 = uVar3 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar8;
        uVar3 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar3 + 1;
      pcVar6[uVar3] = (char)uVar5;
      goto LAB_00120d0d;
    default:
      if (uVar2 == 0x62) {
        SVar1 = (this->_longstr)._allocated;
        pcVar6 = (this->_longstr)._vals;
        uVar3 = (this->_longstr)._size;
        if (SVar1 <= uVar3) {
          SVar8 = uVar3 * 2;
          if (SVar8 == 0) {
            SVar8 = 4;
          }
          pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
          (this->_longstr)._vals = pcVar6;
          (this->_longstr)._allocated = SVar8;
          uVar3 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar3 + 1;
        pcVar6[uVar3] = '\b';
      }
      else {
        if (uVar2 != 0x66) goto switchD_00120dd2_caseD_6f;
        SVar1 = (this->_longstr)._allocated;
        pcVar6 = (this->_longstr)._vals;
        uVar3 = (this->_longstr)._size;
        if (SVar1 <= uVar3) {
          SVar8 = uVar3 * 2;
          if (SVar8 == 0) {
            SVar8 = 4;
          }
          pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
          (this->_longstr)._vals = pcVar6;
          (this->_longstr)._allocated = SVar8;
          uVar3 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar3 + 1;
        pcVar6[uVar3] = '\f';
      }
    }
LAB_00120c10:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_00120cca;
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00120cca:
      this->_currdata = (LexChar)SVar4;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
LAB_00120d0d:
    uVar3 = (ulong)this->_currdata;
    uVar5 = uVar3;
  }
  SVar4 = (*this->_readf)(this->_up);
  if (0xff < SVar4) {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00121194:
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    if (((LexChar)SVar4 != '\"') || (!verbatim)) goto LAB_00121289;
    SVar1 = (this->_longstr)._allocated;
    pcVar6 = (this->_longstr)._vals;
    uVar3 = (this->_longstr)._size;
    if (SVar1 <= uVar3) {
      SVar8 = uVar3 * 2;
      if (SVar8 == 0) {
        SVar8 = 4;
      }
      pcVar6 = (char *)sq_vm_realloc(pcVar6,SVar1,SVar8);
      (this->_longstr)._vals = pcVar6;
      (this->_longstr)._allocated = SVar8;
      uVar3 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar3 + 1;
    pcVar6[uVar3] = '\"';
    uVar3 = (*this->_readf)(this->_up);
    if ((long)uVar3 < 0x100) {
      if (uVar3 != 0) goto LAB_0012121f;
      this->_currdata = '\0';
      this->_reached_eof = 1;
      uVar3 = 0;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0012121f:
      this->_currdata = (LexChar)uVar3;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    goto LAB_00120b29;
  }
  if (SVar4 != 0) goto LAB_00121194;
  this->_currdata = '\0';
  this->_reached_eof = 1;
  this->_currentcolumn = this->_currentcolumn + 1;
LAB_00121289:
  local_50[0]._0_1_ = '\0';
  sqvector<char>::push_back(local_40,(char *)local_50);
  if (ndelim != 0x27) {
    this->_svalue = (this->_longstr)._vals;
    return 0x103;
  }
  SVar1 = (this->_longstr)._size;
  if (SVar1 == 1) {
    pcVar6 = "empty constant";
  }
  else {
    if ((long)(SVar1 - 1) < 2) goto LAB_001212dc;
    pcVar6 = "constant too long";
  }
  (*this->_errfunc)(this->_errtarget,pcVar6);
LAB_001212dc:
  this->_nvalue = (long)*(this->_longstr)._vals;
  return 0x104;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim)
{
    INIT_TEMP_STRING();
    NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                Error(_SC("unfinished string"));
                return -1;
            case _SC('\n'):
                if(!verbatim) Error(_SC("newline in a constant"));
                APPEND_CHAR(CUR_CHAR); NEXT();
                _currentline++;
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = x == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
#ifdef SQUNICODE
#if WCHAR_SIZE == 2
                        AddUTF16(scstrtoul(temp, &stemp, 16));
#else
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
#endif
#else
                        AddUTF8(scstrtoul(temp, &stemp, 16));
#endif
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    default:
                        Error(_SC("unrecognised escaper char"));
                    break;
                    }
                }
                break;
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();
        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        if(len == 0) Error(_SC("empty constant"));
        if(len > 1) Error(_SC("constant too long"));
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    _svalue = &_longstr[0];
    return TK_STRING_LITERAL;
}